

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_10ef85f::HandleWriteImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool append,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  string *psVar5;
  Status SVar6;
  undefined8 *puVar7;
  _func_int **pp_Var8;
  _Ios_Openmode _Var9;
  byte bVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  mode_t mode;
  string fileName;
  string error_1;
  string message;
  string dir;
  ofstream file;
  mode_t local_314;
  string local_310;
  undefined1 local_2f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  string local_2b0;
  pointer local_290;
  pointer local_288;
  undefined1 local_280 [24];
  char *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  undefined8 local_250;
  char *local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  undefined1 local_230 [8];
  pointer local_228;
  _func_int *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_218;
  size_type local_210;
  pointer local_208;
  ios_base local_138 [264];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  bVar4 = cmsys::SystemTools::FileIsFullPath(pbVar1 + 1);
  if (!bVar4) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    local_228 = (psVar5->_M_dataplus)._M_p;
    local_230 = (undefined1  [8])psVar5->_M_string_length;
    local_268 = (char *)&local_260;
    local_280._16_8_ = &DAT_00000001;
    local_260._M_local_buf[0] = 0x2f;
    local_220 = (_func_int *)&DAT_00000001;
    local_208 = pbVar1[1]._M_dataplus._M_p;
    local_210 = pbVar1[1]._M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)local_230;
    paStack_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268;
    cmCatViews_abi_cxx11_(&local_2b0,views);
    std::__cxx11::string::operator=((string *)&local_310,(string *)&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = cmMakefile::CanIWriteThisFile(status->Makefile,&local_310);
  if (bVar4) {
    cmsys::SystemTools::GetFilenamePath(&local_2b0,&local_310);
    cmsys::SystemTools::MakeDirectory(&local_2b0,(mode_t *)0x0);
    local_314 = 0;
    SVar6 = cmsys::SystemTools::GetPermissions(&local_310,&local_314);
    if (SVar6.Kind_ == Success) {
      if ((char)(byte)local_314 < '\0') {
        bVar10 = (byte)local_314 >> 7;
      }
      else {
        bVar10 = 0;
        cmsys::SystemTools::SetPermissions(&local_310,local_314 | 0x90,false);
      }
    }
    else {
      bVar10 = 0;
    }
    _Var9 = _S_out;
    if (append) {
      _Var9 = _S_app;
    }
    std::ofstream::ofstream(local_230,local_310._M_dataplus._M_p,_Var9);
    if ((*(byte *)((long)&local_210 + (long)*(_func_int **)((long)local_230 + -0x18)) & 5) == 0) {
      local_2f0._0_8_ = pbVar1 + 2;
      local_2f0._8_8_ =
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_268 = (char *)0x0;
      local_260._M_allocated_capacity = local_260._M_allocated_capacity & 0xffffffffffffff00;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = &local_260;
      local_280._16_8_ = &local_260;
      cmJoin((string *)&local_2d0,(cmStringRange *)local_2f0,(string_view)(auVar3 << 0x40),
             (string_view)ZEXT816(0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._16_8_ != &local_260) {
        operator_delete((void *)local_280._16_8_,(ulong)(local_260._M_allocated_capacity + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_230,(char *)local_2d0._M_allocated_capacity,local_2d0._8_8_);
      bVar4 = (*(byte *)((long)&local_210 + (long)*(_func_int **)((long)local_230 + -0x18)) & 5) ==
              0;
      if (bVar4) {
        std::ofstream::close();
        if (bVar10 == 0 && local_314 != 0) {
          cmsys::SystemTools::SetPermissions(&local_310,local_314,false);
        }
      }
      else {
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        local_280._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0xe;
        local_268 = "write failed (";
        local_260._M_allocated_capacity = (size_type)local_288;
        local_260._8_8_ = local_290;
        local_250 = 5;
        local_248 = "):\n  ";
        local_240 = local_310._M_string_length;
        local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_310._M_dataplus._M_p;
        views_01._M_len = 4;
        views_01._M_array = (iterator)(local_280 + 0x10);
        cmCatViews_abi_cxx11_((string *)local_2f0,views_01);
        if (local_290 != (pointer)local_280) {
          operator_delete(local_290,(ulong)(local_280._0_8_ + 1));
        }
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((pointer)local_2f0._0_8_ != (pointer)(local_2f0 + 0x10)) {
          operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_allocated_capacity != &local_2c0) {
        operator_delete((void *)local_2d0._M_allocated_capacity,local_2c0._M_allocated_capacity + 1)
        ;
      }
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      local_280._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1c;
      local_268 = "failed to open for writing (";
      local_260._M_allocated_capacity = local_2f0._8_8_;
      local_260._8_8_ = local_2f0._0_8_;
      local_250 = 5;
      local_248 = "):\n  ";
      local_240 = local_310._M_string_length;
      local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p;
      views_00._M_len = 4;
      views_00._M_array = (iterator)(local_280 + 0x10);
      cmCatViews_abi_cxx11_((string *)&local_2d0,views_00);
      if ((pointer)local_2f0._0_8_ != (pointer)(local_2f0 + 0x10)) {
        operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
      }
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_allocated_capacity != &local_2c0) {
        operator_delete((void *)local_2d0._M_allocated_capacity,local_2c0._M_allocated_capacity + 1)
        ;
      }
      bVar4 = false;
    }
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + (long)_VTT[-3]) = _EVP_PKEY_get_bn_param;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_280 + 0x10),"attempted to write a file: ",&local_310);
    puVar7 = (undefined8 *)std::__cxx11::string::append(local_280 + 0x10);
    pp_Var8 = (_func_int **)(puVar7 + 2);
    if ((_func_int **)*puVar7 == pp_Var8) {
      local_220 = *pp_Var8;
      paStack_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar7[3];
      local_230 = (undefined1  [8])&local_220;
    }
    else {
      local_220 = *pp_Var8;
      local_230 = (undefined1  [8])*puVar7;
    }
    local_228 = (pointer)puVar7[1];
    *puVar7 = pp_Var8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._16_8_ != &local_260) {
      operator_delete((void *)local_280._16_8_,(ulong)(local_260._M_allocated_capacity + 1));
    }
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,(ulong)(local_220 + 1));
    }
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool HandleWriteImpl(std::vector<std::string> const& args, bool append,
                     cmExecutionStatus& status)
{
  auto i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', *i);
  }

  i++;

  if (!status.GetMakefile().CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error =
      cmStrCat("failed to open for writing (",
               cmSystemTools::GetLastSystemError(), "):\n  ", fileName);
    status.SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error =
      cmStrCat("write failed (", cmSystemTools::GetLastSystemError(), "):\n  ",
               fileName);
    status.SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}